

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numparse_parsednumber.cpp
# Opt level: O0

void __thiscall icu_63::numparse::impl::ParsedNumber::clear(ParsedNumber *this)

{
  ParsedNumber *this_local;
  
  (this->quantity).bogus = true;
  this->charEnd = 0;
  this->flags = 0;
  UnicodeString::setToBogus(&this->prefix);
  UnicodeString::setToBogus(&this->suffix);
  this->currencyCode[0] = L'\0';
  return;
}

Assistant:

void ParsedNumber::clear() {
    quantity.bogus = true;
    charEnd = 0;
    flags = 0;
    prefix.setToBogus();
    suffix.setToBogus();
    currencyCode[0] = 0;
}